

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O1

void __thiscall cbtCollisionWorldImporter::deleteAllData(cbtCollisionWorldImporter *this)

{
  cbtCollisionWorld *pcVar1;
  cbtCollisionObject *pcVar2;
  cbtCollisionObject **ptr;
  cbtCollisionShape *pcVar3;
  cbtCollisionShape **ptr_00;
  cbtOptimizedBvh *pcVar4;
  cbtOptimizedBvh **ptr_01;
  cbtTriangleInfoMap *pcVar5;
  cbtTriangleInfoMap **ptr_02;
  cbtTriangleIndexVertexArray *pcVar6;
  cbtTriangleIndexVertexArray **ptr_03;
  char *pcVar7;
  char **ptr_04;
  cbtStridingMeshInterfaceData *pcVar8;
  cbtMeshPartData *pcVar9;
  void *pvVar10;
  cbtStridingMeshInterfaceData **ptr_05;
  int **ptr_06;
  short **ptr_07;
  uchar **ptr_08;
  cbtVector3FloatData **ptr_09;
  cbtVector3DoubleData **ptr_10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  if (0 < (this->m_allocatedCollisionObjects).m_size) {
    lVar13 = 0;
    do {
      pcVar1 = this->m_collisionWorld;
      if (pcVar1 != (cbtCollisionWorld *)0x0) {
        (*pcVar1->_vptr_cbtCollisionWorld[0xb])
                  (pcVar1,(this->m_allocatedCollisionObjects).m_data[lVar13]);
      }
      pcVar2 = (this->m_allocatedCollisionObjects).m_data[lVar13];
      if (pcVar2 != (cbtCollisionObject *)0x0) {
        (*pcVar2->_vptr_cbtCollisionObject[1])();
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_allocatedCollisionObjects).m_size);
  }
  ptr = (this->m_allocatedCollisionObjects).m_data;
  if (ptr != (cbtCollisionObject **)0x0) {
    if ((this->m_allocatedCollisionObjects).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr);
    }
    (this->m_allocatedCollisionObjects).m_data = (cbtCollisionObject **)0x0;
  }
  (this->m_allocatedCollisionObjects).m_ownsMemory = true;
  (this->m_allocatedCollisionObjects).m_data = (cbtCollisionObject **)0x0;
  (this->m_allocatedCollisionObjects).m_size = 0;
  (this->m_allocatedCollisionObjects).m_capacity = 0;
  if (0 < (this->m_allocatedCollisionShapes).m_size) {
    lVar13 = 0;
    do {
      pcVar3 = (this->m_allocatedCollisionShapes).m_data[lVar13];
      if (pcVar3 != (cbtCollisionShape *)0x0) {
        (*pcVar3->_vptr_cbtCollisionShape[1])();
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_allocatedCollisionShapes).m_size);
  }
  ptr_00 = (this->m_allocatedCollisionShapes).m_data;
  if (ptr_00 != (cbtCollisionShape **)0x0) {
    if ((this->m_allocatedCollisionShapes).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr_00);
    }
    (this->m_allocatedCollisionShapes).m_data = (cbtCollisionShape **)0x0;
  }
  (this->m_allocatedCollisionShapes).m_ownsMemory = true;
  (this->m_allocatedCollisionShapes).m_data = (cbtCollisionShape **)0x0;
  (this->m_allocatedCollisionShapes).m_size = 0;
  (this->m_allocatedCollisionShapes).m_capacity = 0;
  if (0 < (this->m_allocatedBvhs).m_size) {
    lVar13 = 0;
    do {
      pcVar4 = (this->m_allocatedBvhs).m_data[lVar13];
      if (pcVar4 != (cbtOptimizedBvh *)0x0) {
        (*(pcVar4->super_cbtQuantizedBvh)._vptr_cbtQuantizedBvh[1])();
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_allocatedBvhs).m_size);
  }
  ptr_01 = (this->m_allocatedBvhs).m_data;
  if (ptr_01 != (cbtOptimizedBvh **)0x0) {
    if ((this->m_allocatedBvhs).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr_01);
    }
    (this->m_allocatedBvhs).m_data = (cbtOptimizedBvh **)0x0;
  }
  (this->m_allocatedBvhs).m_ownsMemory = true;
  (this->m_allocatedBvhs).m_data = (cbtOptimizedBvh **)0x0;
  (this->m_allocatedBvhs).m_size = 0;
  (this->m_allocatedBvhs).m_capacity = 0;
  if (0 < (this->m_allocatedTriangleInfoMaps).m_size) {
    lVar13 = 0;
    do {
      pcVar5 = (this->m_allocatedTriangleInfoMaps).m_data[lVar13];
      if (pcVar5 != (cbtTriangleInfoMap *)0x0) {
        (*pcVar5->_vptr_cbtTriangleInfoMap[1])();
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_allocatedTriangleInfoMaps).m_size);
  }
  ptr_02 = (this->m_allocatedTriangleInfoMaps).m_data;
  if (ptr_02 != (cbtTriangleInfoMap **)0x0) {
    if ((this->m_allocatedTriangleInfoMaps).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr_02);
    }
    (this->m_allocatedTriangleInfoMaps).m_data = (cbtTriangleInfoMap **)0x0;
  }
  (this->m_allocatedTriangleInfoMaps).m_ownsMemory = true;
  (this->m_allocatedTriangleInfoMaps).m_data = (cbtTriangleInfoMap **)0x0;
  (this->m_allocatedTriangleInfoMaps).m_size = 0;
  (this->m_allocatedTriangleInfoMaps).m_capacity = 0;
  if (0 < (this->m_allocatedTriangleIndexArrays).m_size) {
    lVar13 = 0;
    do {
      pcVar6 = (this->m_allocatedTriangleIndexArrays).m_data[lVar13];
      if (pcVar6 != (cbtTriangleIndexVertexArray *)0x0) {
        (*(pcVar6->super_cbtStridingMeshInterface)._vptr_cbtStridingMeshInterface[1])();
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_allocatedTriangleIndexArrays).m_size);
  }
  ptr_03 = (this->m_allocatedTriangleIndexArrays).m_data;
  if (ptr_03 != (cbtTriangleIndexVertexArray **)0x0) {
    if ((this->m_allocatedTriangleIndexArrays).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr_03);
    }
    (this->m_allocatedTriangleIndexArrays).m_data = (cbtTriangleIndexVertexArray **)0x0;
  }
  (this->m_allocatedTriangleIndexArrays).m_ownsMemory = true;
  (this->m_allocatedTriangleIndexArrays).m_data = (cbtTriangleIndexVertexArray **)0x0;
  (this->m_allocatedTriangleIndexArrays).m_size = 0;
  (this->m_allocatedTriangleIndexArrays).m_capacity = 0;
  if (0 < (this->m_allocatedNames).m_size) {
    lVar13 = 0;
    do {
      pcVar7 = (this->m_allocatedNames).m_data[lVar13];
      if (pcVar7 != (char *)0x0) {
        operator_delete__(pcVar7);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_allocatedNames).m_size);
  }
  ptr_04 = (this->m_allocatedNames).m_data;
  if (ptr_04 != (char **)0x0) {
    if ((this->m_allocatedNames).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr_04);
    }
    (this->m_allocatedNames).m_data = (char **)0x0;
  }
  (this->m_allocatedNames).m_ownsMemory = true;
  (this->m_allocatedNames).m_data = (char **)0x0;
  (this->m_allocatedNames).m_size = 0;
  (this->m_allocatedNames).m_capacity = 0;
  if (0 < (this->m_allocatedcbtStridingMeshInterfaceDatas).m_size) {
    lVar13 = 0;
    do {
      pcVar8 = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data[lVar13];
      if (0 < pcVar8->m_numMeshParts) {
        lVar11 = 0x28;
        lVar12 = 0;
        do {
          pcVar9 = pcVar8->m_meshPartsPtr;
          pvVar10 = *(void **)((long)pcVar9 + lVar11 + -0x28);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          pvVar10 = *(void **)((long)pcVar9 + lVar11 + -0x20);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          pvVar10 = *(void **)((long)pcVar9 + lVar11 + -0x18);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          pvVar10 = *(void **)((long)pcVar9 + lVar11 + -0x10);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          pvVar10 = *(void **)((long)&pcVar9->m_vertices3f + lVar11);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          pvVar10 = *(void **)((long)pcVar9 + lVar11 + -8);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          lVar12 = lVar12 + 1;
          lVar11 = lVar11 + 0x38;
        } while (lVar12 < pcVar8->m_numMeshParts);
      }
      if (pcVar8->m_meshPartsPtr != (cbtMeshPartData *)0x0) {
        operator_delete__(pcVar8->m_meshPartsPtr);
      }
      operator_delete(pcVar8,0x20);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_allocatedcbtStridingMeshInterfaceDatas).m_size);
  }
  ptr_05 = (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data;
  if (ptr_05 != (cbtStridingMeshInterfaceData **)0x0) {
    if ((this->m_allocatedcbtStridingMeshInterfaceDatas).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr_05);
    }
    (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data = (cbtStridingMeshInterfaceData **)0x0;
  }
  (this->m_allocatedcbtStridingMeshInterfaceDatas).m_ownsMemory = true;
  (this->m_allocatedcbtStridingMeshInterfaceDatas).m_data = (cbtStridingMeshInterfaceData **)0x0;
  (this->m_allocatedcbtStridingMeshInterfaceDatas).m_size = 0;
  (this->m_allocatedcbtStridingMeshInterfaceDatas).m_capacity = 0;
  if (0 < (this->m_indexArrays).m_size) {
    lVar13 = 0;
    do {
      cbtAlignedFreeInternal((this->m_indexArrays).m_data[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_indexArrays).m_size);
  }
  ptr_06 = (this->m_indexArrays).m_data;
  if (ptr_06 != (int **)0x0) {
    if ((this->m_indexArrays).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr_06);
    }
    (this->m_indexArrays).m_data = (int **)0x0;
  }
  (this->m_indexArrays).m_ownsMemory = true;
  (this->m_indexArrays).m_data = (int **)0x0;
  (this->m_indexArrays).m_size = 0;
  (this->m_indexArrays).m_capacity = 0;
  if (0 < (this->m_shortIndexArrays).m_size) {
    lVar13 = 0;
    do {
      cbtAlignedFreeInternal((this->m_shortIndexArrays).m_data[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_shortIndexArrays).m_size);
  }
  ptr_07 = (this->m_shortIndexArrays).m_data;
  if (ptr_07 != (short **)0x0) {
    if ((this->m_shortIndexArrays).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr_07);
    }
    (this->m_shortIndexArrays).m_data = (short **)0x0;
  }
  (this->m_shortIndexArrays).m_ownsMemory = true;
  (this->m_shortIndexArrays).m_data = (short **)0x0;
  (this->m_shortIndexArrays).m_size = 0;
  (this->m_shortIndexArrays).m_capacity = 0;
  if (0 < (this->m_charIndexArrays).m_size) {
    lVar13 = 0;
    do {
      cbtAlignedFreeInternal((this->m_charIndexArrays).m_data[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_charIndexArrays).m_size);
  }
  ptr_08 = (this->m_charIndexArrays).m_data;
  if (ptr_08 != (uchar **)0x0) {
    if ((this->m_charIndexArrays).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr_08);
    }
    (this->m_charIndexArrays).m_data = (uchar **)0x0;
  }
  (this->m_charIndexArrays).m_ownsMemory = true;
  (this->m_charIndexArrays).m_data = (uchar **)0x0;
  (this->m_charIndexArrays).m_size = 0;
  (this->m_charIndexArrays).m_capacity = 0;
  if (0 < (this->m_floatVertexArrays).m_size) {
    lVar13 = 0;
    do {
      cbtAlignedFreeInternal((this->m_floatVertexArrays).m_data[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_floatVertexArrays).m_size);
  }
  ptr_09 = (this->m_floatVertexArrays).m_data;
  if (ptr_09 != (cbtVector3FloatData **)0x0) {
    if ((this->m_floatVertexArrays).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr_09);
    }
    (this->m_floatVertexArrays).m_data = (cbtVector3FloatData **)0x0;
  }
  (this->m_floatVertexArrays).m_ownsMemory = true;
  (this->m_floatVertexArrays).m_data = (cbtVector3FloatData **)0x0;
  (this->m_floatVertexArrays).m_size = 0;
  (this->m_floatVertexArrays).m_capacity = 0;
  if (0 < (this->m_doubleVertexArrays).m_size) {
    lVar13 = 0;
    do {
      cbtAlignedFreeInternal((this->m_doubleVertexArrays).m_data[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_doubleVertexArrays).m_size);
  }
  ptr_10 = (this->m_doubleVertexArrays).m_data;
  if (ptr_10 != (cbtVector3DoubleData **)0x0) {
    if ((this->m_doubleVertexArrays).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr_10);
    }
    (this->m_doubleVertexArrays).m_data = (cbtVector3DoubleData **)0x0;
  }
  (this->m_doubleVertexArrays).m_ownsMemory = true;
  (this->m_doubleVertexArrays).m_data = (cbtVector3DoubleData **)0x0;
  (this->m_doubleVertexArrays).m_size = 0;
  (this->m_doubleVertexArrays).m_capacity = 0;
  return;
}

Assistant:

void cbtCollisionWorldImporter::deleteAllData()
{
	int i;

	for (i = 0; i < m_allocatedCollisionObjects.size(); i++)
	{
		if (m_collisionWorld)
			m_collisionWorld->removeCollisionObject(m_allocatedCollisionObjects[i]);
		delete m_allocatedCollisionObjects[i];
	}

	m_allocatedCollisionObjects.clear();

	for (i = 0; i < m_allocatedCollisionShapes.size(); i++)
	{
		delete m_allocatedCollisionShapes[i];
	}
	m_allocatedCollisionShapes.clear();

	for (i = 0; i < m_allocatedBvhs.size(); i++)
	{
		delete m_allocatedBvhs[i];
	}
	m_allocatedBvhs.clear();

	for (i = 0; i < m_allocatedTriangleInfoMaps.size(); i++)
	{
		delete m_allocatedTriangleInfoMaps[i];
	}
	m_allocatedTriangleInfoMaps.clear();
	for (i = 0; i < m_allocatedTriangleIndexArrays.size(); i++)
	{
		delete m_allocatedTriangleIndexArrays[i];
	}
	m_allocatedTriangleIndexArrays.clear();
	for (i = 0; i < m_allocatedNames.size(); i++)
	{
		delete[] m_allocatedNames[i];
	}
	m_allocatedNames.clear();

	for (i = 0; i < m_allocatedcbtStridingMeshInterfaceDatas.size(); i++)
	{
		cbtStridingMeshInterfaceData* curData = m_allocatedcbtStridingMeshInterfaceDatas[i];

		for (int a = 0; a < curData->m_numMeshParts; a++)
		{
			cbtMeshPartData* curPart = &curData->m_meshPartsPtr[a];
			if (curPart->m_vertices3f)
				delete[] curPart->m_vertices3f;

			if (curPart->m_vertices3d)
				delete[] curPart->m_vertices3d;

			if (curPart->m_indices32)
				delete[] curPart->m_indices32;

			if (curPart->m_3indices16)
				delete[] curPart->m_3indices16;

			if (curPart->m_indices16)
				delete[] curPart->m_indices16;

			if (curPart->m_3indices8)
				delete[] curPart->m_3indices8;
		}
		delete[] curData->m_meshPartsPtr;
		delete curData;
	}
	m_allocatedcbtStridingMeshInterfaceDatas.clear();

	for (i = 0; i < m_indexArrays.size(); i++)
	{
		cbtAlignedFree(m_indexArrays[i]);
	}
	m_indexArrays.clear();

	for (i = 0; i < m_shortIndexArrays.size(); i++)
	{
		cbtAlignedFree(m_shortIndexArrays[i]);
	}
	m_shortIndexArrays.clear();

	for (i = 0; i < m_charIndexArrays.size(); i++)
	{
		cbtAlignedFree(m_charIndexArrays[i]);
	}
	m_charIndexArrays.clear();

	for (i = 0; i < m_floatVertexArrays.size(); i++)
	{
		cbtAlignedFree(m_floatVertexArrays[i]);
	}
	m_floatVertexArrays.clear();

	for (i = 0; i < m_doubleVertexArrays.size(); i++)
	{
		cbtAlignedFree(m_doubleVertexArrays[i]);
	}
	m_doubleVertexArrays.clear();
}